

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O2

void __thiscall
CoreML::TreeEnsembleClassifier::setOutputClassList
          (TreeEnsembleClassifier *this,vector<long,_std::allocator<long>_> *classes)

{
  TreeEnsembleClassifier *pTVar1;
  Int64Vector *pIVar2;
  size_t i;
  ulong uVar3;
  
  pTVar1 = Specification::Model::mutable_treeensembleclassifier
                     ((this->super_TreeEnsembleBase).super_Model.m_spec.
                      super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  pIVar2 = Specification::TreeEnsembleClassifier::mutable_int64classlabels(pTVar1);
  (pIVar2->vector_).current_size_ = 0;
  for (uVar3 = 0;
      uVar3 < (ulong)((long)(classes->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(classes->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
    pTVar1 = Specification::Model::mutable_treeensembleclassifier
                       ((this->super_TreeEnsembleBase).super_Model.m_spec.
                        super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
    pIVar2 = Specification::TreeEnsembleClassifier::mutable_int64classlabels(pTVar1);
    Specification::Int64Vector::add_vector
              (pIVar2,(classes->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar3]);
  }
  return;
}

Assistant:

void TreeEnsembleClassifier::setOutputClassList(const std::vector<int64_t>& classes) {
        m_spec->mutable_treeensembleclassifier()->mutable_int64classlabels()->clear_vector();
        for(size_t i = 0; i < classes.size(); ++i) {
            m_spec->mutable_treeensembleclassifier()->mutable_int64classlabels()->add_vector(classes[i]);
        }
    }